

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::equivalent(path *p1,path *p2,error_code *ec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_type *pvVar4;
  int *piVar5;
  undefined8 *in_RDX;
  error_code eVar6;
  int rc2;
  int e1;
  int rc1;
  stat s2;
  stat s1;
  bool local_165;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  stat local_140;
  stat local_b0;
  undefined8 *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  std::error_code::clear
            ((error_code *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  pvVar4 = path::c_str((path *)0x1d7c29);
  iVar2 = stat(pvVar4,&local_b0);
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  pvVar4 = path::c_str((path *)0x1d7c55);
  iVar3 = stat(pvVar4,&local_140);
  if ((iVar2 == 0) && (iVar3 == 0)) {
    local_165 = false;
    if (((local_b0.st_dev == local_140.st_dev) &&
        (local_165 = false, local_b0.st_ino == local_140.st_ino)) &&
       (local_165 = false, local_b0.st_size == local_140.st_size)) {
      local_165 = local_b0.st_mtim.tv_sec == local_140.st_mtim.tv_sec;
    }
    local_1 = local_165;
  }
  else {
    if (iVar1 == 0) {
      __errno_location();
    }
    eVar6 = detail::make_system_error(in_stack_fffffffffffffea4);
    *local_20 = CONCAT44(in_stack_fffffffffffffea4,eVar6._M_value);
    local_20[1] = eVar6._M_cat;
    local_1 = false;
  }
  return local_1;
}

Assistant:

GHC_INLINE bool equivalent(const path& p1, const path& p2, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    detail::unique_handle file1(::CreateFileW(GHC_NATIVEWP(p1), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));
    auto e1 = ::GetLastError();
    detail::unique_handle file2(::CreateFileW(GHC_NATIVEWP(p2), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));
    if (!file1 || !file2) {
#ifdef LWG_2937_BEHAVIOUR
        ec = detail::make_system_error(e1 ? e1 : ::GetLastError());
#else
        if (file1 == file2) {
            ec = detail::make_system_error(e1 ? e1 : ::GetLastError());
        }
#endif
        return false;
    }
    BY_HANDLE_FILE_INFORMATION inf1, inf2;
    if (!::GetFileInformationByHandle(file1.get(), &inf1)) {
        ec = detail::make_system_error();
        return false;
    }
    if (!::GetFileInformationByHandle(file2.get(), &inf2)) {
        ec = detail::make_system_error();
        return false;
    }
    return inf1.ftLastWriteTime.dwLowDateTime == inf2.ftLastWriteTime.dwLowDateTime && inf1.ftLastWriteTime.dwHighDateTime == inf2.ftLastWriteTime.dwHighDateTime && inf1.nFileIndexHigh == inf2.nFileIndexHigh && inf1.nFileIndexLow == inf2.nFileIndexLow &&
           inf1.nFileSizeHigh == inf2.nFileSizeHigh && inf1.nFileSizeLow == inf2.nFileSizeLow && inf1.dwVolumeSerialNumber == inf2.dwVolumeSerialNumber;
#else
    struct ::stat s1, s2;
    auto rc1 = ::stat(p1.c_str(), &s1);
    auto e1 = errno;
    auto rc2 = ::stat(p2.c_str(), &s2);
    if (rc1 || rc2) {
#ifdef LWG_2937_BEHAVIOUR
        ec = detail::make_system_error(e1 ? e1 : errno);
#else
        if (rc1 && rc2) {
            ec = detail::make_system_error(e1 ? e1 : errno);
        }
#endif
        return false;
    }
    return s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino && s1.st_size == s2.st_size && s1.st_mtime == s2.st_mtime;
#endif
}